

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDetectionResultColumn.cpp
# Opt level: O0

Nullable<ZXing::Pdf417::Codeword> * __thiscall
ZXing::Pdf417::DetectionResultColumn::codewordNearby(DetectionResultColumn *this,int imageRow)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  const_reference pvVar7;
  long in_RSI;
  DetectionResultColumn *in_RDI;
  int nearImageRow;
  int i;
  int index;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  DetectionResultColumn *this_00;
  int local_14;
  
  this_00 = in_RDI;
  iVar5 = imageRowToCodewordIndex(in_RDI,in_stack_ffffffffffffffcc);
  pvVar7 = std::
           vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
           ::operator[]((vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                         *)(in_RSI + 0x78),(long)iVar5);
  bVar4 = ZXing::operator!=(pvVar7,(nullptr_t)0x0);
  if (bVar4) {
    pvVar7 = std::
             vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
             ::operator[]((vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                           *)(in_RSI + 0x78),(long)iVar5);
    uVar1._0_1_ = pvVar7->m_hasValue;
    uVar1._1_3_ = *(undefined3 *)&pvVar7->field_0x1;
    uVar1._4_4_ = (pvVar7->m_value)._startX;
    (this_00->_boundingBox)._imgWidth = (int)uVar1;
    (this_00->_boundingBox)._imgHeight = (int)((ulong)uVar1 >> 0x20);
    *(undefined8 *)&(this_00->_boundingBox)._topLeft = *(undefined8 *)&(pvVar7->m_value)._endX;
    (this_00->_boundingBox)._topLeft.m_value.super_PointF.x = *(double *)&(pvVar7->m_value)._value;
  }
  else {
    for (local_14 = 1; local_14 < 5; local_14 = local_14 + 1) {
      iVar5 = imageRowToCodewordIndex(this_00,in_stack_ffffffffffffffcc);
      iVar5 = iVar5 - local_14;
      if (-1 < iVar5) {
        pvVar7 = std::
                 vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                 ::operator[]((vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                               *)(in_RSI + 0x78),(long)iVar5);
        bVar4 = ZXing::operator!=(pvVar7,(nullptr_t)0x0);
        if (bVar4) {
          pvVar7 = std::
                   vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                   ::operator[]((vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                                 *)(in_RSI + 0x78),(long)iVar5);
          uVar2._0_1_ = pvVar7->m_hasValue;
          uVar2._1_3_ = *(undefined3 *)&pvVar7->field_0x1;
          uVar2._4_4_ = (pvVar7->m_value)._startX;
          (this_00->_boundingBox)._imgWidth = (int)uVar2;
          (this_00->_boundingBox)._imgHeight = (int)((ulong)uVar2 >> 0x20);
          *(undefined8 *)&(this_00->_boundingBox)._topLeft = *(undefined8 *)&(pvVar7->m_value)._endX
          ;
          (this_00->_boundingBox)._topLeft.m_value.super_PointF.x =
               *(double *)&(pvVar7->m_value)._value;
          return (Nullable<ZXing::Pdf417::Codeword> *)in_RDI;
        }
      }
      iVar5 = imageRowToCodewordIndex(this_00,in_stack_ffffffffffffffcc);
      iVar5 = iVar5 + local_14;
      in_stack_ffffffffffffffcc = iVar5;
      iVar6 = Size<std::vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>>>>
                        ((vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                          *)this_00);
      if (in_stack_ffffffffffffffcc < iVar6) {
        pvVar7 = std::
                 vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                 ::operator[]((vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                               *)(in_RSI + 0x78),(long)iVar5);
        bVar4 = ZXing::operator!=(pvVar7,(nullptr_t)0x0);
        if (bVar4) {
          pvVar7 = std::
                   vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                   ::operator[]((vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                                 *)(in_RSI + 0x78),(long)iVar5);
          uVar3._0_1_ = pvVar7->m_hasValue;
          uVar3._1_3_ = *(undefined3 *)&pvVar7->field_0x1;
          uVar3._4_4_ = (pvVar7->m_value)._startX;
          (this_00->_boundingBox)._imgWidth = (int)uVar3;
          (this_00->_boundingBox)._imgHeight = (int)((ulong)uVar3 >> 0x20);
          *(undefined8 *)&(this_00->_boundingBox)._topLeft = *(undefined8 *)&(pvVar7->m_value)._endX
          ;
          (this_00->_boundingBox)._topLeft.m_value.super_PointF.x =
               *(double *)&(pvVar7->m_value)._value;
          return (Nullable<ZXing::Pdf417::Codeword> *)in_RDI;
        }
      }
    }
    Nullable<ZXing::Pdf417::Codeword>::Nullable
              ((Nullable<ZXing::Pdf417::Codeword> *)this_00,
               (nullptr_t)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return (Nullable<ZXing::Pdf417::Codeword> *)in_RDI;
}

Assistant:

Nullable<Codeword>
DetectionResultColumn::codewordNearby(int imageRow) const
{
	int index = imageRowToCodewordIndex(imageRow);
	if (_codewords[index] != nullptr) {
		return _codewords[index];
	}

	for (int i = 1; i < MAX_NEARBY_DISTANCE; i++) {
		int nearImageRow = imageRowToCodewordIndex(imageRow) - i;
		if (nearImageRow >= 0) {
			if (_codewords[nearImageRow] != nullptr) {
				return _codewords[nearImageRow];
			}
		}
		nearImageRow = imageRowToCodewordIndex(imageRow) + i;
		if (nearImageRow < Size(_codewords)) {
			if (_codewords[nearImageRow] != nullptr) {
				return _codewords[nearImageRow];
			}
		}
	}
	return nullptr;
}